

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O0

void __thiscall lzham::task_pool::deinit(task_pool *this)

{
  long in_RDI;
  semaphore *unaff_retaddr;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  long releaseCount;
  
  if (*(int *)(in_RDI + 0x210) != 0) {
    releaseCount = in_RDI;
    join(this);
    atomic_exchange32((atomic32_t *)(in_RDI + 0x2c0),1);
    semaphore::release(unaff_retaddr,releaseCount);
    for (in_stack_fffffffffffffff4 = 0; in_stack_fffffffffffffff4 < *(uint *)(in_RDI + 0x210);
        in_stack_fffffffffffffff4 = in_stack_fffffffffffffff4 + 1) {
      pthread_join(*(pthread_t *)(in_RDI + 0x218 + (ulong)in_stack_fffffffffffffff4 * 8),
                   (void **)0x0);
    }
    *(undefined4 *)(in_RDI + 0x210) = 0;
    atomic_exchange32((atomic32_t *)(in_RDI + 0x2c0),0);
  }
  tsstack<lzham::task_pool::task,_16U>::clear
            ((tsstack<lzham::task_pool::task,_16U> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x2b8) = 0;
  return;
}

Assistant:

void task_pool::deinit()
   {
      if (m_num_threads)
      {
         join();

         atomic_exchange32(&m_exit_flag, true);

         m_tasks_available.release(m_num_threads);

         for (uint i = 0; i < m_num_threads; i++)
            pthread_join(m_threads[i], NULL);

         m_num_threads = 0;

         atomic_exchange32(&m_exit_flag, false);
      }

      m_task_stack.clear();
      m_num_outstanding_tasks = 0;
   }